

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfsubs.cpp
# Opt level: O0

void __thiscall
icu_63::NFSubstitution::doSubstitution
          (NFSubstitution *this,double number,UnicodeString *toInsertInto,int32_t _pos,
          int32_t recursionCount,UErrorCode *status)

{
  NFRuleSet *pNVar1;
  UBool UVar2;
  int64_t number_00;
  double number_01;
  double dVar3;
  undefined1 local_80 [8];
  UnicodeString temp;
  NFRule *infiniteRule;
  double numberToFormat;
  UErrorCode *status_local;
  int32_t recursionCount_local;
  int32_t _pos_local;
  UnicodeString *toInsertInto_local;
  double number_local;
  NFSubstitution *this_local;
  
  (*(this->super_UObject)._vptr_UObject[9])(number);
  UVar2 = uprv_isInfinite_63(number_01);
  if (UVar2 == '\0') {
    dVar3 = uprv_floor_63(number_01);
    if (((number_01 != dVar3) || (NAN(number_01) || NAN(dVar3))) ||
       (this->ruleSet == (NFRuleSet *)0x0)) {
      if (this->ruleSet == (NFRuleSet *)0x0) {
        if (this->numberFormat != (DecimalFormat *)0x0) {
          UnicodeString::UnicodeString((UnicodeString *)local_80);
          NumberFormat::format
                    (&this->numberFormat->super_NumberFormat,number_01,(UnicodeString *)local_80);
          UnicodeString::insert(toInsertInto,_pos + this->pos,(UnicodeString *)local_80);
          UnicodeString::~UnicodeString((UnicodeString *)local_80);
        }
      }
      else {
        NFRuleSet::format(this->ruleSet,number_01,toInsertInto,_pos + this->pos,recursionCount,
                          status);
      }
    }
    else {
      pNVar1 = this->ruleSet;
      number_00 = util64_fromDouble(number_01);
      NFRuleSet::format(pNVar1,number_00,toInsertInto,_pos + this->pos,recursionCount,status);
    }
  }
  else {
    pNVar1 = this->ruleSet;
    dVar3 = uprv_getInfinity_63();
    temp.fUnion._48_8_ = NFRuleSet::findDoubleRule(pNVar1,dVar3);
    NFRule::doFormat((NFRule *)temp.fUnion._48_8_,number_01,toInsertInto,_pos + this->pos,
                     recursionCount,status);
  }
  return;
}

Assistant:

void
NFSubstitution::doSubstitution(double number, UnicodeString& toInsertInto, int32_t _pos, int32_t recursionCount, UErrorCode& status) const {
    // perform a transformation on the number being formatted that
    // is dependent on the type of substitution this is
    double numberToFormat = transformNumber(number);

    if (uprv_isInfinite(numberToFormat)) {
        // This is probably a minus rule. Combine it with an infinite rule.
        const NFRule *infiniteRule = ruleSet->findDoubleRule(uprv_getInfinity());
        infiniteRule->doFormat(numberToFormat, toInsertInto, _pos + this->pos, recursionCount, status);
        return;
    }

    // if the result is an integer, from here on out we work in integer
    // space (saving time and memory and preserving accuracy)
    if (numberToFormat == uprv_floor(numberToFormat) && ruleSet != NULL) {
        ruleSet->format(util64_fromDouble(numberToFormat), toInsertInto, _pos + this->pos, recursionCount, status);

        // if the result isn't an integer, then call either our rule set's
        // format() method or our DecimalFormat's format() method to
        // format the result
    } else {
        if (ruleSet != NULL) {
            ruleSet->format(numberToFormat, toInsertInto, _pos + this->pos, recursionCount, status);
        } else if (numberFormat != NULL) {
            UnicodeString temp;
            numberFormat->format(numberToFormat, temp);
            toInsertInto.insert(_pos + this->pos, temp);
        }
    }
}